

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparc.c
# Opt level: O2

int main(void)

{
  arm_cpsmode_type aVar1;
  arm_cpsflag_type aVar2;
  uint8_t *buffer;
  uchar *str;
  cs_detail *pcVar3;
  size_t count;
  cs_err cVar4;
  char *pcVar5;
  size_t len;
  size_t len_00;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  arm_cc *paVar9;
  cs_insn *insn;
  long local_40;
  size_t local_38;
  
  lVar7 = 0;
  do {
    if (lVar7 == 2) {
      return 0;
    }
    local_40 = lVar7;
    cVar4 = cs_open(CS_ARCH_SPARC,(&DAT_00266574)[lVar7 * 8],&handle);
    if (cVar4 == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_00266578)[lVar7 * 4];
      str = (uchar *)(&DAT_00266580)[lVar7 * 4];
      local_38 = cs_disasm(handle,buffer,(size_t)str,0x1000,0,&insn);
      if (local_38 == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00266588)[lVar7 * 4]);
        print_string_hex((char *)buffer,str,len_00);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00266588)[lVar7 * 4]);
        print_string_hex((char *)buffer,str,len);
        puts("Disasm:");
        for (sVar6 = 0; count = local_38, sVar6 != local_38; sVar6 = sVar6 + 1) {
          printf("0x%lx:\t%s\t%s\n",insn[sVar6].address,insn[sVar6].mnemonic,insn[sVar6].op_str);
          pcVar3 = insn[sVar6].detail;
          if (pcVar3 != (cs_detail *)0x0) {
            if ((pcVar3->field_6).x86.rex != '\0') {
              printf("\top_count: %u\n");
            }
            paVar9 = &(pcVar3->field_6).arm.cc;
            for (uVar8 = 0; uVar8 < (pcVar3->field_6).x86.rex; uVar8 = uVar8 + 1) {
              aVar1 = paVar9[-2];
              if (aVar1 == ARM_CPSMODE_ID) {
                printf("\t\toperands[%u].type: MEM\n",uVar8 & 0xffffffff);
                if ((char)paVar9[-1] != ARM_CPSFLAG_INVALID) {
                  pcVar5 = cs_reg_name(handle,(uint)(byte)(char)paVar9[-1]);
                  printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar8 & 0xffffffff,pcVar5);
                }
                if (*(byte *)((long)paVar9 + -3) != 0) {
                  pcVar5 = cs_reg_name(handle,(uint)*(byte *)((long)paVar9 + -3));
                  printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar8 & 0xffffffff,pcVar5);
                }
                aVar2 = *paVar9;
                if (aVar2 != ARM_CPSFLAG_INVALID) {
                  pcVar5 = "\t\t\toperands[%u].mem.disp: 0x%x\n";
                  goto LAB_0014244d;
                }
              }
              else if (aVar1 == ARM_CPSMODE_IE) {
                aVar2 = paVar9[-1];
                pcVar5 = "\t\toperands[%u].type: IMM = 0x%x\n";
LAB_0014244d:
                printf(pcVar5,uVar8 & 0xffffffff,(ulong)aVar2);
              }
              else if (aVar1 == 1) {
                pcVar5 = cs_reg_name(handle,paVar9[-1]);
                printf("\t\toperands[%u].type: REG = %s\n",uVar8 & 0xffffffff,pcVar5);
              }
              paVar9 = paVar9 + 3;
            }
            if ((pcVar3->field_6).arm64.cc != ARM64_CC_INVALID) {
              printf("\tCode condition: %u\n");
            }
            if ((pcVar3->field_6).arm.vector_size != 0) {
              printf("\tHint code: %u\n");
            }
            putchar(10);
          }
        }
        printf("0x%lx:\n",(ulong)insn[local_38 - 1].size + insn[local_38 - 1].address);
        cs_free(insn,count);
      }
      putchar(10);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
    }
    lVar7 = local_40 + 1;
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}